

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ConfigDeclarationSyntax::setChild
          (ConfigDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *pSVar3;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *pSVar4;
  SyntaxNode *pSVar5;
  NamedBlockClauseSyntax *pNVar6;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *pSVar7;
  logic_error *this_00;
  Token TVar8;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 0xb) {
    switch(index) {
    case 0:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar5);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->config).kind = TVar8.kind;
      (this->config).field_0x2 = TVar8._2_1_;
      (this->config).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->config).rawLen = TVar8.rawLen;
      (this->config).info = TVar8.info;
      break;
    case 2:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar8.kind;
      (this->name).field_0x2 = TVar8._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->name).rawLen = TVar8.rawLen;
      (this->name).info = TVar8.info;
      break;
    case 3:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi1).kind = TVar8.kind;
      (this->semi1).field_0x2 = TVar8._2_1_;
      (this->semi1).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->semi1).rawLen = TVar8.rawLen;
      (this->semi1).info = TVar8.info;
      break;
    case 4:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::
               as<slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>>
                         (pSVar5);
      (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->localparams).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->localparams).super_SyntaxListBase.childCount =
           (pSVar3->super_SyntaxListBase).childCount;
      sVar1 = (pSVar3->
              super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
              ).size_;
      (this->localparams).
      super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.data_
           = (pSVar3->
             super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
             ).data_;
      (this->localparams).
      super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.size_
           = sVar1;
      break;
    case 5:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->design).kind = TVar8.kind;
      (this->design).field_0x2 = TVar8._2_1_;
      (this->design).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->design).rawLen = TVar8.rawLen;
      (this->design).info = TVar8.info;
      break;
    case 6:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>>
                         (pSVar5);
      (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->topCells).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->topCells).super_SyntaxListBase.childCount = (pSVar4->super_SyntaxListBase).childCount;
      sVar1 = (pSVar4->
              super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>).size_
      ;
      (this->topCells).
      super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar4->super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>)
           .data_;
      (this->topCells).
      super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 7:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi2).kind = TVar8.kind;
      (this->semi2).field_0x2 = TVar8._2_1_;
      (this->semi2).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->semi2).rawLen = TVar8.rawLen;
      (this->semi2).info = TVar8.info;
      break;
    case 8:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar7 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>>(pSVar5);
      (this->rules).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->rules).super_SyntaxListBase.childCount = (pSVar7->super_SyntaxListBase).childCount;
      sVar1 = (pSVar7->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>).size_;
      (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar7->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>).data_;
      (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 9:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->endconfig).kind = TVar8.kind;
      (this->endconfig).field_0x2 = TVar8._2_1_;
      (this->endconfig).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->endconfig).rawLen = TVar8.rawLen;
      (this->endconfig).info = TVar8.info;
      break;
    case 10:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pNVar6 = (NamedBlockClauseSyntax *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        pNVar6 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar5);
      }
      this->blockName = pNVar6;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0xb51);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ConfigDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: config = child.token(); return;
        case 2: name = child.token(); return;
        case 3: semi1 = child.token(); return;
        case 4: localparams = child.node()->as<SyntaxList<ParameterDeclarationStatementSyntax>>(); return;
        case 5: design = child.token(); return;
        case 6: topCells = child.node()->as<SyntaxList<ConfigCellIdentifierSyntax>>(); return;
        case 7: semi2 = child.token(); return;
        case 8: rules = child.node()->as<SyntaxList<ConfigRuleSyntax>>(); return;
        case 9: endconfig = child.token(); return;
        case 10: blockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}